

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool ReadASC(string *ASCPath,VecVector3d *Accel,VecVector3d *Gyro)

{
  Scalar SVar1;
  byte bVar2;
  istream *piVar3;
  Scalar *pSVar4;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  ostream *poVar5;
  _Ios_Openmode in_EDI;
  string head;
  double SOW;
  int status;
  int week;
  Vector3d accel;
  Vector3d gyro;
  stringstream buff;
  string line;
  ifstream ASCFile;
  char *in_stack_fffffffffffffa58;
  ostream *in_stack_fffffffffffffa60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffa70;
  string local_488 [32];
  double local_468;
  int local_460;
  int local_45c [14];
  undefined1 local_422;
  undefined1 local_421;
  undefined8 local_420;
  undefined8 local_418;
  undefined1 local_40a;
  undefined1 local_409;
  undefined8 local_408;
  undefined8 local_400;
  undefined1 local_3f2;
  undefined1 local_3f1;
  undefined8 local_3f0;
  undefined8 local_3e8;
  stringstream local_3e0 [16];
  ostream local_3d0 [376];
  string local_258 [32];
  undefined4 local_238;
  long local_228 [68];
  byte local_1;
  
  std::ifstream::ifstream((string *)local_228);
  std::ifstream::open((string *)local_228,in_EDI);
  bVar2 = std::ios::operator!((ios *)((long)local_228 + *(long *)(local_228[0] + -0x18)));
  if ((bVar2 & 1) == 0) {
    while (bVar2 = std::ios::eof(), ((bVar2 ^ 0xff) & 1) != 0) {
      std::__cxx11::string::string(local_258);
      std::__cxx11::stringstream::stringstream(local_3e0);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_228,local_258)
      ;
      local_3e8 = std::__cxx11::string::begin();
      local_3f0 = std::__cxx11::string::end();
      local_3f1 = 0x2c;
      local_3f2 = 0x20;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                 (char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      local_400 = std::__cxx11::string::begin();
      local_408 = std::__cxx11::string::end();
      local_409 = 0x3b;
      local_40a = 0x20;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                 (char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      local_418 = std::__cxx11::string::begin();
      local_420 = std::__cxx11::string::end();
      local_421 = 0x2a;
      local_422 = 0x20;
      std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                 (char *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      std::operator<<(local_3d0,local_258);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1a6f43);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)0x1a6f52);
      std::__cxx11::string::string(local_488);
      piVar3 = std::operator>>((istream *)local_3e0,local_488);
      piVar3 = (istream *)std::istream::operator>>(piVar3,local_45c);
      piVar3 = (istream *)std::istream::operator>>(piVar3,&local_468);
      piVar3 = (istream *)std::istream::operator>>(piVar3,local_45c);
      piVar3 = (istream *)std::istream::operator>>(piVar3,&local_468);
      piVar3 = (istream *)std::istream::operator>>(piVar3,&local_460);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffa70._M_current,
                          (Index)in_stack_fffffffffffffa68._M_current);
      piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffa70._M_current,
                          (Index)in_stack_fffffffffffffa68._M_current);
      piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffa70._M_current,
                          (Index)in_stack_fffffffffffffa68._M_current);
      piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffa70._M_current,
                          (Index)in_stack_fffffffffffffa68._M_current);
      piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffa70._M_current,
                          (Index)in_stack_fffffffffffffa68._M_current);
      piVar3 = (istream *)std::istream::operator>>(piVar3,pSVar4);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffa70._M_current,
                          (Index)in_stack_fffffffffffffa68._M_current);
      std::istream::operator>>(piVar3,pSVar4);
      this = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_fffffffffffffa70._M_current,
                        (Index)in_stack_fffffffffffffa68._M_current);
      SVar1 = *(Scalar *)this;
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                          in_stack_fffffffffffffa70._M_current,
                          (Index)in_stack_fffffffffffffa68._M_current);
      *pSVar4 = -SVar1;
      if (local_460 != 0x4d) {
        poVar5 = std::operator<<((ostream *)&std::cout,"observations are not operable!\n");
        in_stack_fffffffffffffa70._M_current = (char *)std::operator<<(poVar5,"time: ");
        in_stack_fffffffffffffa68._M_current =
             (char *)std::ostream::operator<<(in_stack_fffffffffffffa70._M_current,local_45c[0]);
        in_stack_fffffffffffffa60 =
             std::operator<<((ostream *)in_stack_fffffffffffffa68._M_current,", ");
        in_stack_fffffffffffffa58 =
             (char *)std::ostream::operator<<(in_stack_fffffffffffffa60,local_468);
        std::ostream::operator<<(in_stack_fffffffffffffa58,std::endl<char,std::char_traits<char>>);
      }
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=(this,pSVar4);
      Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=(this,pSVar4);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)in_stack_fffffffffffffa70._M_current,
                  (value_type *)in_stack_fffffffffffffa68._M_current);
      std::
      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   *)in_stack_fffffffffffffa70._M_current,
                  (value_type *)in_stack_fffffffffffffa68._M_current);
      std::__cxx11::string::~string(local_488);
      std::__cxx11::stringstream::~stringstream(local_3e0);
      std::__cxx11::string::~string(local_258);
    }
    local_1 = 1;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"open error!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
  local_238 = 1;
  std::ifstream::~ifstream(local_228);
  return (bool)(local_1 & 1);
}

Assistant:

bool ReadASC(string ASCPath, VecVector3d &Accel, VecVector3d &Gyro)
{
    ifstream ASCFile;
    ASCFile.open(ASCPath);
    if(!ASCFile)
    {
        cerr << "open error!" << endl;
        return false;
    }

    while(!ASCFile.eof())
    {
        /* 去标点处理 */
        string line;
        stringstream buff;
        getline(ASCFile, line);
        replace(line.begin(), line.end(), ',', ' ');
        replace(line.begin(), line.end(), ';', ' ');
        replace(line.begin(), line.end(), '*', ' ');
        buff << line;

        /* 数据存入内存 */
        Vector3d gyro, accel;
        /* 本次实验暂时未使用 */
        int week, status;
        double SOW;
        string head;
        buff >> head >> week >> SOW >> week >> SOW >> status >> accel[2] >> accel[1] >> accel[0]
             >> gyro[2] >> gyro[1] >> gyro[0];
        /* Y轴的输出是加了一个负号 */
        accel[1] = -accel[1];
        
        if(status != 77)
            cout << "observations are not operable!\n" << "time: " << week << ", " << SOW << endl;
            
        accel *= ACCEL_SCALE;
        gyro *= GYRO_SCALE;
        Accel.push_back(accel);
        Gyro.push_back(gyro);
    }
    
    return true;
}